

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

string_view __thiscall
absl::lts_20250127::log_internal::anon_unknown_4::Basename
          (anon_unknown_4 *this,string_view filepath)

{
  string_view sVar1;
  size_type sVar2;
  size_t path;
  string_view filepath_local;
  
  filepath_local._M_len = filepath._M_len;
  path = (size_t)this;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)&path,'/',
                     0xffffffffffffffff);
  if (sVar2 != 0xffffffffffffffff) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&path,sVar2 + 1);
  }
  sVar1._M_str = (char *)filepath_local._M_len;
  sVar1._M_len = path;
  return sVar1;
}

Assistant:

absl::string_view Basename(absl::string_view filepath) {
#ifdef _WIN32
  size_t path = filepath.find_last_of("/\\");
#else
  size_t path = filepath.find_last_of('/');
#endif
  if (path != filepath.npos) filepath.remove_prefix(path + 1);
  return filepath;
}